

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O1

FT_Error split_sdf_conic(FT_Memory memory,FT_26D6_Vec *control_points,FT_UInt max_splits,
                        SDF_Edge **out)

{
  FT_Error FVar1;
  int iVar2;
  int iVar3;
  SDF_Edge *right;
  SDF_Edge *left;
  FT_26D6_Vec cpos [5];
  SDF_Edge_ *local_88;
  SDF_Edge *local_80;
  FT_26D6_Vec local_78;
  long local_68;
  long lStack_60;
  FT_26D6_Vec local_58;
  long local_48;
  long local_40;
  FT_Pos local_38;
  FT_Pos FStack_30;
  
  if (out != (SDF_Edge **)0x0) {
    local_78.x = control_points->x;
    local_78.y = control_points->y;
    local_38 = control_points[2].x;
    FStack_30 = control_points[2].y;
    local_68._0_4_ = (int)control_points[1].x;
    lStack_60._0_4_ = (int)control_points[1].y;
    iVar3 = (int)local_78.x + (int)local_68;
    local_68._0_4_ = (int)local_38 + (int)local_68;
    local_48 = (long)((int)local_68 / 2);
    iVar2 = iVar3 + 3 + (int)local_68;
    if (-1 < iVar3 + (int)local_68) {
      iVar2 = iVar3 + (int)local_68;
    }
    local_58.x = (FT_Pos)(iVar2 >> 2);
    local_68 = (long)(iVar3 / 2);
    iVar3 = (int)local_78.y + (int)lStack_60;
    lStack_60._0_4_ = (int)FStack_30 + (int)lStack_60;
    local_40 = (long)((int)lStack_60 / 2);
    iVar2 = iVar3 + 3 + (int)lStack_60;
    if (-1 < iVar3 + (int)lStack_60) {
      iVar2 = iVar3 + (int)lStack_60;
    }
    local_58.y = (FT_Pos)(iVar2 >> 2);
    lStack_60 = (long)(iVar3 / 2);
    if (max_splits < 3) {
      FVar1 = sdf_edge_new(memory,&local_80);
      if (FVar1 == 0) {
        FVar1 = sdf_edge_new(memory,&local_88);
        if (FVar1 == 0) {
          (local_80->start_pos).x = local_78.x;
          (local_80->start_pos).y = local_78.y;
          (local_80->end_pos).x = local_58.x;
          (local_80->end_pos).y = local_58.y;
          local_80->edge_type = SDF_EDGE_LINE;
          (local_88->start_pos).x = local_58.x;
          (local_88->start_pos).y = local_58.y;
          (local_88->end_pos).x = local_38;
          (local_88->end_pos).y = FStack_30;
          local_88->edge_type = SDF_EDGE_LINE;
          local_80->next = local_88;
          local_88->next = *out;
          *out = local_80;
          FVar1 = 0;
        }
      }
    }
    else {
      FVar1 = split_sdf_conic(memory,&local_78,max_splits >> 1,out);
      if (FVar1 == 0) {
        FVar1 = split_sdf_conic(memory,&local_58,max_splits >> 1,out);
      }
    }
    return FVar1;
  }
  return 6;
}

Assistant:

static FT_Error
  split_sdf_conic( FT_Memory     memory,
                   FT_26D6_Vec*  control_points,
                   FT_UInt       max_splits,
                   SDF_Edge**    out )
  {
    FT_Error     error = FT_Err_Ok;
    FT_26D6_Vec  cpos[5];
    SDF_Edge*    left,*  right;


    if ( !memory || !out  )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* split conic outline */
    cpos[0] = control_points[0];
    cpos[1] = control_points[1];
    cpos[2] = control_points[2];

    split_conic( cpos );

    /* If max number of splits is done */
    /* then stop and add the lines to  */
    /* the list.                       */
    if ( max_splits <= 2 )
      goto Append;

    /* Otherwise keep splitting. */
    FT_CALL( split_sdf_conic( memory, &cpos[0], max_splits / 2, out ) );
    FT_CALL( split_sdf_conic( memory, &cpos[2], max_splits / 2, out ) );

    /* [NOTE]: This is not an efficient way of   */
    /* splitting the curve.  Check the deviation */
    /* instead and stop if the deviation is less */
    /* than a pixel.                             */

    goto Exit;

  Append:
    /* Do allocation and add the lines to the list. */

    FT_CALL( sdf_edge_new( memory, &left ) );
    FT_CALL( sdf_edge_new( memory, &right ) );

    left->start_pos  = cpos[0];
    left->end_pos    = cpos[2];
    left->edge_type  = SDF_EDGE_LINE;

    right->start_pos = cpos[2];
    right->end_pos   = cpos[4];
    right->edge_type = SDF_EDGE_LINE;

    left->next  = right;
    right->next = (*out);
    *out        = left;

  Exit:
    return error;
  }